

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O0

int ft_black_new(FT_Memory memory,black_PRaster *araster)

{
  black_PRaster raster_00;
  black_PRaster raster;
  black_PRaster *ppbStack_18;
  FT_Error error;
  black_PRaster *araster_local;
  FT_Memory memory_local;
  
  *araster = (black_PRaster)0x0;
  ppbStack_18 = araster;
  araster_local = (black_PRaster *)memory;
  raster_00 = (black_PRaster)ft_mem_alloc(memory,8,(FT_Error *)((long)&raster + 4));
  if (raster._4_4_ == 0) {
    raster_00->memory = araster_local;
    ft_black_init(raster_00);
    *ppbStack_18 = raster_00;
  }
  return raster._4_4_;
}

Assistant:

static int
  ft_black_new( FT_Memory       memory,
                black_PRaster  *araster )
  {
    FT_Error       error;
    black_PRaster  raster = NULL;


    *araster = 0;
    if ( !FT_NEW( raster ) )
    {
      raster->memory = memory;
      ft_black_init( raster );

      *araster = raster;
    }

    return error;
  }